

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderPerformanceMeasurer.cpp
# Opt level: O0

void __thiscall
deqp::gls::ShaderPerformanceMeasurer::logMeasurementInfo
          (ShaderPerformanceMeasurer *this,TestLog *log)

{
  MeasureState *this_00;
  int iVar1;
  size_type sVar2;
  TestLog *pTVar3;
  undefined4 uVar4;
  undefined4 uVar8;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  allocator<char> local_3e9;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  LogNumber<float> local_378;
  allocator<char> local_309;
  string local_308;
  allocator<char> local_2e1;
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  LogNumber<float> local_298;
  allocator<char> local_229;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  LogNumber<float> local_1b8;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_e9;
  string local_e8;
  LogNumber<float> local_c8;
  double local_60;
  double framesPerSecond;
  double mvertPerSecond;
  double mfragPerSecond;
  deInt64 numVertices;
  deInt64 numPixels;
  deInt64 numQuadGrids;
  deUint64 dStack_28;
  int numFrames;
  deUint64 totalTime;
  MeasureState *measureState;
  TestLog *log_local;
  ShaderPerformanceMeasurer *this_local;
  undefined1 auVar5 [16];
  
  measureState = (MeasureState *)log;
  log_local = (TestLog *)this;
  totalTime = (deUint64)TheilSenCalibrator::getMeasureState(&this->m_calibrator);
  dStack_28 = MeasureState::getTotalTime((MeasureState *)totalTime);
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(totalTime + 0x10));
  numQuadGrids._4_4_ = (int)sVar2;
  numPixels = (deInt64)(*(int *)(totalTime + 8) * numQuadGrids._4_4_);
  numVertices = (long)this->m_viewportWidth * (long)this->m_viewportHeight * numPixels;
  iVar1 = getNumVertices(this->m_gridSizeX,this->m_gridSizeY);
  mfragPerSecond = (double)(iVar1 * numPixels);
  uVar8 = (undefined4)(dStack_28 >> 0x20);
  auVar5._8_4_ = uVar8;
  auVar5._0_8_ = dStack_28;
  auVar5._12_4_ = 0x45300000;
  uVar4 = (undefined4)dStack_28;
  mvertPerSecond =
       (double)numVertices /
       ((auVar5._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,uVar4) - 4503599627370496.0));
  auVar6._8_4_ = uVar8;
  auVar6._0_8_ = dStack_28;
  auVar6._12_4_ = 0x45300000;
  framesPerSecond =
       (double)(long)mfragPerSecond /
       ((auVar6._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,uVar4) - 4503599627370496.0));
  auVar7._8_4_ = uVar8;
  auVar7._0_8_ = dStack_28;
  auVar7._12_4_ = 0x45300000;
  local_60 = (double)numQuadGrids._4_4_ /
             (((auVar7._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,uVar4) - 4503599627370496.0)) / 1000000.0);
  logCalibrationInfo((TestLog *)measureState,&this->m_calibrator);
  this_00 = measureState;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"FramesPerSecond",&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"Frames per second in measurement",&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"Frames/s",&local_149);
  tcu::LogNumber<float>::LogNumber
            (&local_c8,&local_e8,&local_120,&local_148,QP_KEY_TAG_PERFORMANCE,(float)local_60);
  pTVar3 = tcu::TestLog::operator<<((TestLog *)this_00,&local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"FragmentsPerVertices",&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,"Vertex-fragment ratio",&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"Fragments/Vertices",&local_229);
  tcu::LogNumber<float>::LogNumber
            (&local_1b8,&local_1d8,&local_200,&local_228,QP_KEY_TAG_NONE,
             (float)numVertices / (float)(long)mfragPerSecond);
  pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_1b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"FragmentPerf",&local_2b9)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e0,"Fragment performance",&local_2e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"MPix/s",&local_309);
  tcu::LogNumber<float>::LogNumber
            (&local_298,&local_2b8,&local_2e0,&local_308,QP_KEY_TAG_PERFORMANCE,
             (float)mvertPerSecond);
  pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_298);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"VertexPerf",&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c0,"Vertex performance",&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"MVert/s",&local_3e9);
  tcu::LogNumber<float>::LogNumber
            (&local_378,&local_398,&local_3c0,&local_3e8,QP_KEY_TAG_PERFORMANCE,
             (float)framesPerSecond);
  tcu::TestLog::operator<<(pTVar3,&local_378);
  tcu::LogNumber<float>::~LogNumber(&local_378);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator(&local_3e9);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator(&local_399);
  tcu::LogNumber<float>::~LogNumber(&local_298);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator(&local_309);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  tcu::LogNumber<float>::~LogNumber(&local_1b8);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  tcu::LogNumber<float>::~LogNumber(&local_c8);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  return;
}

Assistant:

void ShaderPerformanceMeasurer::logMeasurementInfo (TestLog& log) const
{
	DE_ASSERT(m_state == STATE_FINISHED);

	const MeasureState& measureState(m_calibrator.getMeasureState());

	// Compute totals.
	deUint64	totalTime			= measureState.getTotalTime();
	int			numFrames			= (int)measureState.frameTimes.size();
	deInt64		numQuadGrids		= measureState.numDrawCalls * numFrames;
	deInt64		numPixels			= (deInt64)m_viewportWidth * (deInt64)m_viewportHeight * numQuadGrids;
	deInt64		numVertices			= (deInt64)getNumVertices(m_gridSizeX, m_gridSizeY) * numQuadGrids;
	double		mfragPerSecond		= (double)numPixels / (double)totalTime;
	double		mvertPerSecond		= (double)numVertices / (double)totalTime;
	double		framesPerSecond		= (double)numFrames / ((double)totalTime / 1000000.0);

	logCalibrationInfo(log, m_calibrator);

	log << TestLog::Float("FramesPerSecond",		"Frames per second in measurement",	"Frames/s",				QP_KEY_TAG_PERFORMANCE,	(float)framesPerSecond)
		<< TestLog::Float("FragmentsPerVertices",	"Vertex-fragment ratio",			"Fragments/Vertices",	QP_KEY_TAG_NONE,		(float)numPixels / (float)numVertices)
		<< TestLog::Float("FragmentPerf",			"Fragment performance",				"MPix/s",				QP_KEY_TAG_PERFORMANCE, (float)mfragPerSecond)
		<< TestLog::Float("VertexPerf",				"Vertex performance",				"MVert/s",				QP_KEY_TAG_PERFORMANCE, (float)mvertPerSecond);
}